

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall google::protobuf::Arena::AddBlock(Arena *this,Block *b)

{
  internal::Mutex::Lock((Mutex *)(this + 0x30));
  b->next = *(Block **)(this + 8);
  *(Block **)(this + 8) = b;
  if (b->size != b->pos) {
    *(Block **)(this + 0x10) = b;
  }
  *(size_t *)(this + 0x18) = *(long *)(this + 0x18) + b->size;
  internal::Mutex::Unlock((Mutex *)(this + 0x30));
  return;
}

Assistant:

void Arena::AddBlock(Block* b) {
  MutexLock l(&blocks_lock_);
  AddBlockInternal(b);
}